

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O3

void __thiscall
gimage::HighDynamicRangeFusionBase::addMulWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *target,ImageFloat *image,ImageFloat *weight)

{
  float *pfVar1;
  int iVar2;
  float ***pppfVar3;
  float ***pppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iVar2 = target->depth;
  if (0 < (long)iVar2) {
    pppfVar3 = target->img;
    lVar10 = target->height * target->width;
    pppfVar4 = image->img;
    pfVar5 = **weight->img;
    lVar9 = 0;
    do {
      if (0 < lVar10) {
        pfVar6 = *pppfVar3[lVar9];
        pfVar7 = *pppfVar4[lVar9];
        lVar8 = 0;
        do {
          pfVar1 = (float *)((long)pfVar6 + lVar8);
          *pfVar1 = *(float *)((long)pfVar7 + lVar8) * *(float *)((long)pfVar5 + lVar8) + *pfVar1;
          lVar8 = lVar8 + 4;
        } while (pfVar1 + 1 < pfVar6 + lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::addMulWeight(ImageFloat &target, ImageFloat &image, ImageFloat &weight)
{
  for (int d=0; d<target.getDepth(); d++)
  {
    float *p=target.getPtr(0, 0, d);
    float *pn=p+target.getWidth()*target.getHeight();
    float *im=image.getPtr(0, 0, d);
    float *w=weight.getPtr(0, 0, 0);

    while (p < pn)
    {
      *p++ += *im++ * *w++;
    }
  }
}